

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O1

void __thiscall wasm::WasmBinaryWriter::writeDataCount(WasmBinaryWriter *this)

{
  Module *pMVar1;
  int32_t start;
  ulong __n;
  void *__buf;
  LEB<unsigned_int,_unsigned_char> local_1c;
  
  pMVar1 = this->wasm;
  if ((((pMVar1->features).features & 0x10) != 0) &&
     ((pMVar1->dataSegments).
      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pMVar1->dataSegments).
      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    start = startSection<wasm::BinaryConsts::Section>(this,DataCount);
    __n = (ulong)((long)(this->wasm->dataSegments).
                        super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->wasm->dataSegments).
                       super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
    local_1c.value = (uint)__n;
    LEB<unsigned_int,_unsigned_char>::write(&local_1c,(int)this->o,__buf,__n);
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeDataCount() {
  if (!wasm->features.hasBulkMemory() || !wasm->dataSegments.size()) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::DataCount);
  o << U32LEB(wasm->dataSegments.size());
  finishSection(start);
}